

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QPolygon * __thiscall
QGraphicsView::mapFromScene(QPolygon *__return_storage_ptr__,QGraphicsView *this,QRectF *rect)

{
  QTransform *pQVar1;
  QGraphicsViewPrivate *this_00;
  long lVar2;
  QPoint *b;
  QPoint *pQVar3;
  pointer pQVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  QArrayData *d;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  QArrayData *local_48;
  qreal qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if ((this_00->field_0x300 & 0x10) == 0) {
    pQVar1 = &this_00->matrix;
    local_48 = (QArrayData *)rect->xp;
    qStack_40 = rect->yp;
    auVar18 = QTransform::map((QPointF *)pQVar1);
    qStack_40 = rect->yp;
    local_48 = (QArrayData *)(rect->xp + rect->w);
    auVar19 = QTransform::map((QPointF *)pQVar1);
    local_48 = (QArrayData *)(rect->w + rect->xp);
    qStack_40 = rect->h + rect->yp;
    auVar20 = QTransform::map((QPointF *)pQVar1);
    local_48 = (QArrayData *)rect->xp;
    qStack_40 = rect->yp + rect->h;
    auVar21 = QTransform::map((QPointF *)pQVar1);
  }
  else {
    auVar18._0_8_ = rect->xp;
    auVar18._8_8_ = rect->yp;
    dVar7 = rect->w + rect->xp;
    auVar19._8_8_ = rect->yp;
    auVar19._0_8_ = dVar7;
    dVar8 = rect->h + rect->yp;
    auVar21._8_8_ = dVar8;
    auVar21._0_8_ = rect->xp;
    auVar20._8_8_ = dVar8;
    auVar20._0_8_ = dVar7;
  }
  local_88 = auVar21._8_8_;
  dStack_80 = auVar21._0_8_;
  local_78 = auVar20._8_8_;
  dStack_70 = auVar20._0_8_;
  local_a8 = auVar19._8_8_;
  dStack_a0 = auVar19._0_8_;
  local_98 = auVar18._8_8_;
  dStack_90 = auVar18._0_8_;
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  lVar2 = this_00->scrollX;
  if ((this_00->field_0x300 & 0x20) != 0) {
    QGraphicsViewPrivate::updateScroll(this_00);
  }
  dVar7 = (double)this_00->scrollY;
  (__return_storage_ptr__->super_QList<QPoint>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QPoint>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QPoint>).d.ptr = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QPoint *)QArrayData::allocate(&local_48,8,0x10,4,KeepSize);
  (__return_storage_ptr__->super_QList<QPoint>).d.d = (Data *)local_48;
  (__return_storage_ptr__->super_QList<QPoint>).d.ptr = pQVar3;
  pQVar3[2].xp = 0;
  pQVar3[2].yp = 0;
  pQVar3[3].xp = 0;
  pQVar3[3].yp = 0;
  pQVar3->xp = 0;
  pQVar3->yp = 0;
  pQVar3[1].xp = 0;
  pQVar3[1].yp = 0;
  (__return_storage_ptr__->super_QList<QPoint>).d.size = 4;
  pQVar4 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  dVar8 = (double)lVar2;
  auVar9._0_8_ = (double)((ulong)(local_98 - dVar7) & 0x8000000000000000 | 0x3fe0000000000000) +
                 (local_98 - dVar7);
  auVar9._8_8_ = (double)((ulong)(dStack_90 - dVar8) & 0x8000000000000000 | 0x3fe0000000000000) +
                 (dStack_90 - dVar8);
  auVar14._0_8_ =
       (double)((ulong)(local_a8 - dVar7) & 0x8000000000000000 | 0x3fe0000000000000) +
       (local_a8 - dVar7);
  auVar14._8_8_ =
       (double)((ulong)(dStack_a0 - dVar8) & 0x8000000000000000 | 0x3fe0000000000000) +
       (dStack_a0 - dVar8);
  auVar11._0_8_ =
       (double)((ulong)(local_78 - dVar7) & 0x8000000000000000 | 0x3fe0000000000000) +
       (local_78 - dVar7);
  auVar11._8_8_ =
       (double)((ulong)(dStack_70 - dVar8) & 0x8000000000000000 | 0x3fe0000000000000) +
       (dStack_70 - dVar8);
  auVar16._0_8_ =
       (double)((ulong)(local_88 - dVar7) & 0x8000000000000000 | 0x3fe0000000000000) +
       (local_88 - dVar7);
  auVar16._8_8_ =
       (double)((ulong)(dStack_80 - dVar8) & 0x8000000000000000 | 0x3fe0000000000000) +
       (dStack_80 - dVar8);
  auVar17 = minpd(_DAT_0066f5d0,auVar16);
  auVar18 = minpd(_DAT_0066f5d0,auVar11);
  auVar19 = minpd(_DAT_0066f5d0,auVar14);
  auVar21 = minpd(_DAT_0066f5d0,auVar9);
  auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar21._8_8_);
  auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar21._0_8_);
  auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  auVar16 = packssdw(auVar15,auVar12);
  auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar18._8_8_);
  auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar18._0_8_);
  auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
  auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
  auVar20 = packssdw(auVar10,auVar13);
  auVar20 = packssdw(auVar20,auVar16);
  auVar20 = packsswb(auVar20,auVar20);
  uVar6 = (ulong)(uint)(int)auVar21._8_8_;
  uVar5 = (ulong)(uint)(int)auVar21._0_8_ << 0x20;
  if ((auVar20 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar5 = 0x8000000000000000;
  }
  if ((auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar6 = 0x80000000;
  }
  *pQVar4 = (QPoint)(uVar6 | uVar5);
  uVar6 = (ulong)(uint)(int)auVar19._8_8_;
  uVar5 = (ulong)(uint)(int)auVar19._0_8_ << 0x20;
  if ((auVar20 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar5 = 0x8000000000000000;
  }
  if ((auVar20 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar6 = 0x80000000;
  }
  pQVar4 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar4[1] = (QPoint)(uVar6 | uVar5);
  uVar6 = (ulong)(uint)(int)auVar18._8_8_;
  uVar5 = (ulong)(uint)(int)auVar18._0_8_ << 0x20;
  if ((auVar20 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar5 = 0x8000000000000000;
  }
  if ((auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar6 = 0x80000000;
  }
  pQVar4 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar4[2] = (QPoint)(uVar6 | uVar5);
  uVar6 = (ulong)(uint)(int)auVar17._8_8_;
  uVar5 = (ulong)(uint)(int)auVar17._0_8_ << 0x20;
  if ((auVar20 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar5 = 0x8000000000000000;
  }
  if ((auVar20 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar6 = 0x80000000;
  }
  pQVar4 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar4[3] = (QPoint)(uVar6 | uVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygon QGraphicsView::mapFromScene(const QRectF &rect) const
{
    Q_D(const QGraphicsView);
    QPointF tl;
    QPointF tr;
    QPointF br;
    QPointF bl;
    if (!d->identityMatrix) {
        const QTransform &x = d->matrix;
        tl = x.map(rect.topLeft());
        tr = x.map(rect.topRight());
        br = x.map(rect.bottomRight());
        bl = x.map(rect.bottomLeft());
    } else {
        tl = rect.topLeft();
        tr = rect.topRight();
        br = rect.bottomRight();
        bl = rect.bottomLeft();
    }
    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    tl -= scrollOffset;
    tr -= scrollOffset;
    br -= scrollOffset;
    bl -= scrollOffset;

    QPolygon poly(4);
    poly[0] = tl.toPoint();
    poly[1] = tr.toPoint();
    poly[2] = br.toPoint();
    poly[3] = bl.toPoint();
    return poly;
}